

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void suboption(connectdata *conn)

{
  char cVar1;
  Curl_easy *data_00;
  void *pvVar2;
  char *pcVar3;
  int iVar4;
  size_t sVar5;
  ssize_t sVar6;
  uint *puVar7;
  undefined8 in_stack_fffffffffffff678;
  uint uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  size_t tmplen;
  TELNET *tn;
  Curl_easy *data;
  char varval [128];
  char varname [128];
  size_t sStack_828;
  int err;
  size_t len;
  ssize_t bytes_written;
  uchar temp [2048];
  curl_slist *v;
  connectdata *conn_local;
  
  uVar8 = (uint)((ulong)in_stack_fffffffffffff678 >> 0x20);
  uVar9 = 0;
  uVar10 = 0;
  varval[0x78] = '\0';
  varval[0x79] = '\0';
  varval[0x7a] = '\0';
  varval[0x7b] = '\0';
  varval[0x7c] = '\0';
  varval[0x7d] = '\0';
  varval[0x7e] = '\0';
  varval[0x7f] = '\0';
  varval[0x68] = '\0';
  varval[0x69] = '\0';
  varval[0x6a] = '\0';
  varval[0x6b] = '\0';
  varval[0x6c] = '\0';
  varval[0x6d] = '\0';
  varval[0x6e] = '\0';
  varval[0x6f] = '\0';
  varval[0x70] = '\0';
  varval[0x71] = '\0';
  varval[0x72] = '\0';
  varval[0x73] = '\0';
  varval[0x74] = '\0';
  varval[0x75] = '\0';
  varval[0x76] = '\0';
  varval[0x77] = '\0';
  varval[0x58] = '\0';
  varval[0x59] = '\0';
  varval[0x5a] = '\0';
  varval[0x5b] = '\0';
  varval[0x5c] = '\0';
  varval[0x5d] = '\0';
  varval[0x5e] = '\0';
  varval[0x5f] = '\0';
  varval[0x60] = '\0';
  varval[0x61] = '\0';
  varval[0x62] = '\0';
  varval[99] = '\0';
  varval[100] = '\0';
  varval[0x65] = '\0';
  varval[0x66] = '\0';
  varval[0x67] = '\0';
  varval[0x48] = '\0';
  varval[0x49] = '\0';
  varval[0x4a] = '\0';
  varval[0x4b] = '\0';
  varval[0x4c] = '\0';
  varval[0x4d] = '\0';
  varval[0x4e] = '\0';
  varval[0x4f] = '\0';
  varval[0x50] = '\0';
  varval[0x51] = '\0';
  varval[0x52] = '\0';
  varval[0x53] = '\0';
  varval[0x54] = '\0';
  varval[0x55] = '\0';
  varval[0x56] = '\0';
  varval[0x57] = '\0';
  varval[0x38] = '\0';
  varval[0x39] = '\0';
  varval[0x3a] = '\0';
  varval[0x3b] = '\0';
  varval[0x3c] = '\0';
  varval[0x3d] = '\0';
  varval[0x3e] = '\0';
  varval[0x3f] = '\0';
  varval[0x40] = '\0';
  varval[0x41] = '\0';
  varval[0x42] = '\0';
  varval[0x43] = '\0';
  varval[0x44] = '\0';
  varval[0x45] = '\0';
  varval[0x46] = '\0';
  varval[0x47] = '\0';
  varval[0x28] = '\0';
  varval[0x29] = '\0';
  varval[0x2a] = '\0';
  varval[0x2b] = '\0';
  varval[0x2c] = '\0';
  varval[0x2d] = '\0';
  varval[0x2e] = '\0';
  varval[0x2f] = '\0';
  varval[0x30] = '\0';
  varval[0x31] = '\0';
  varval[0x32] = '\0';
  varval[0x33] = '\0';
  varval[0x34] = '\0';
  varval[0x35] = '\0';
  varval[0x36] = '\0';
  varval[0x37] = '\0';
  varval[0x18] = '\0';
  varval[0x19] = '\0';
  varval[0x1a] = '\0';
  varval[0x1b] = '\0';
  varval[0x1c] = '\0';
  varval[0x1d] = '\0';
  varval[0x1e] = '\0';
  varval[0x1f] = '\0';
  varval[0x20] = '\0';
  varval[0x21] = '\0';
  varval[0x22] = '\0';
  varval[0x23] = '\0';
  varval[0x24] = '\0';
  varval[0x25] = '\0';
  varval[0x26] = '\0';
  varval[0x27] = '\0';
  varval[8] = '\0';
  varval[9] = '\0';
  varval[10] = '\0';
  varval[0xb] = '\0';
  varval[0xc] = '\0';
  varval[0xd] = '\0';
  varval[0xe] = '\0';
  varval[0xf] = '\0';
  varval[0x10] = '\0';
  varval[0x11] = '\0';
  varval[0x12] = '\0';
  varval[0x13] = '\0';
  varval[0x14] = '\0';
  varval[0x15] = '\0';
  varval[0x16] = '\0';
  varval[0x17] = '\0';
  data = (Curl_easy *)0x0;
  varval[0] = '\0';
  varval[1] = '\0';
  varval[2] = '\0';
  varval[3] = '\0';
  varval[4] = '\0';
  varval[5] = '\0';
  varval[6] = '\0';
  varval[7] = '\0';
  data_00 = conn->data;
  pvVar2 = (data_00->req).protop;
  printsub(data_00,0x3c,(uchar *)((long)pvVar2 + 0x1cb8),
           (*(long *)((long)pvVar2 + 0x1ec0) - *(long *)((long)pvVar2 + 0x1eb8)) + 2);
  pcVar3 = *(char **)((long)pvVar2 + 0x1eb8);
  *(char **)((long)pvVar2 + 0x1eb8) = pcVar3 + 1;
  cVar1 = *pcVar3;
  if (cVar1 == '\x18') {
    sVar5 = strlen((char *)((long)pvVar2 + 0x1c08));
    curl_msnprintf((char *)&bytes_written,0x800,"%c%c%c%c%s%c%c",0xff,0xfa,0x18,(ulong)uVar8 << 0x20
                   ,(long)pvVar2 + 0x1c08,0xff,0xf0,uVar9,uVar10);
    sVar6 = send(conn->sock[0],&bytes_written,sVar5 + 6,0x4000);
    if (sVar6 < 0) {
      puVar7 = (uint *)__errno_location();
      Curl_failf(data_00,"Sending data failed (%d)",(ulong)*puVar7);
    }
    printsub(data_00,0x3e,(uchar *)((long)&bytes_written + 2),sVar5 + 4);
  }
  else if (cVar1 == '#') {
    sVar5 = strlen((char *)((long)pvVar2 + 0x1c28));
    curl_msnprintf((char *)&bytes_written,0x800,"%c%c%c%c%s%c%c",0xff,0xfa,0x23,(ulong)uVar8 << 0x20
                   ,(long)pvVar2 + 0x1c28,0xff,0xf0,uVar9,uVar10);
    sVar6 = send(conn->sock[0],&bytes_written,sVar5 + 6,0x4000);
    if (sVar6 < 0) {
      puVar7 = (uint *)__errno_location();
      Curl_failf(data_00,"Sending data failed (%d)",(ulong)*puVar7);
    }
    printsub(data_00,0x3e,(uchar *)((long)&bytes_written + 2),sVar5 + 4);
  }
  else if (cVar1 == '\'') {
    curl_msnprintf((char *)&bytes_written,0x800,"%c%c%c%c",0xff,0xfa,0x27,(ulong)uVar8 << 0x20);
    sStack_828 = 4;
    for (temp._2040_8_ = *(undefined8 *)((long)pvVar2 + 0x1cb0); temp._2040_8_ != 0;
        temp._2040_8_ = *(undefined8 *)(temp._2040_8_ + 8)) {
      sVar5 = strlen(*(char **)temp._2040_8_);
      if ((sStack_828 + sVar5 + 1 < 0x7fa) &&
         (iVar4 = __isoc99_sscanf(*(undefined8 *)temp._2040_8_,"%127[^,],%127s",varval + 0x78,&data)
         , iVar4 != 0)) {
        curl_msnprintf((char *)(temp + (sStack_828 - 8)),0x800 - sStack_828,"%c%s%c%s",0,
                       varval + 0x78,1,&data);
        sStack_828 = sVar5 + 1 + sStack_828;
      }
    }
    curl_msnprintf((char *)(temp + (sStack_828 - 8)),0x800 - sStack_828,"%c%c",0xff,0xf0);
    sVar6 = send(conn->sock[0],&bytes_written,sStack_828 + 2,0x4000);
    if (sVar6 < 0) {
      puVar7 = (uint *)__errno_location();
      Curl_failf(data_00,"Sending data failed (%d)",(ulong)*puVar7);
    }
    printsub(data_00,0x3e,(uchar *)((long)&bytes_written + 2),sStack_828);
  }
  return;
}

Assistant:

static void suboption(struct connectdata *conn)
{
  struct curl_slist *v;
  unsigned char temp[2048];
  ssize_t bytes_written;
  size_t len;
  int err;
  char varname[128] = "";
  char varval[128] = "";
  struct Curl_easy *data = conn->data;
  struct TELNET *tn = (struct TELNET *)data->req.protop;

  printsub(data, '<', (unsigned char *)tn->subbuffer, CURL_SB_LEN(tn) + 2);
  switch(CURL_SB_GET(tn)) {
    case CURL_TELOPT_TTYPE:
      len = strlen(tn->subopt_ttype) + 4 + 2;
      msnprintf((char *)temp, sizeof(temp),
                "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_TTYPE,
                CURL_TELQUAL_IS, tn->subopt_ttype, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_XDISPLOC:
      len = strlen(tn->subopt_xdisploc) + 4 + 2;
      msnprintf((char *)temp, sizeof(temp),
                "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_XDISPLOC,
                CURL_TELQUAL_IS, tn->subopt_xdisploc, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_NEW_ENVIRON:
      msnprintf((char *)temp, sizeof(temp),
                "%c%c%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_NEW_ENVIRON,
                CURL_TELQUAL_IS);
      len = 4;

      for(v = tn->telnet_vars; v; v = v->next) {
        size_t tmplen = (strlen(v->data) + 1);
        /* Add the variable only if it fits */
        if(len + tmplen < (int)sizeof(temp)-6) {
          if(sscanf(v->data, "%127[^,],%127s", varname, varval)) {
            msnprintf((char *)&temp[len], sizeof(temp) - len,
                      "%c%s%c%s", CURL_NEW_ENV_VAR, varname,
                      CURL_NEW_ENV_VALUE, varval);
            len += tmplen;
          }
        }
      }
      msnprintf((char *)&temp[len], sizeof(temp) - len,
                "%c%c", CURL_IAC, CURL_SE);
      len += 2;
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
  }
  return;
}